

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool processSources(cmTarget *tgt,
                   vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                   *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *srcs,
                   hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmLinkImplItem *pcVar2;
  pointer pcVar3;
  cmMakefile *this;
  cmCompiledGeneratorExpression *__x;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *this_00;
  bool bVar4;
  pointer ppTVar5;
  char *pcVar6;
  cmSourceFile *this_01;
  string *psVar7;
  ostream *poVar8;
  long *plVar9;
  cmake *pcVar10;
  byte bVar11;
  size_type *psVar12;
  long *plVar13;
  long lVar14;
  string *sourceName;
  pointer pbVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  bool bVar17;
  bool bVar18;
  byte local_2b1;
  string fullPath;
  string usedSources;
  string local_268;
  cmTarget *local_248;
  cmMakefile *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  pointer local_1d0;
  cmGeneratorExpressionDAGChecker *local_1c8;
  string *local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b8;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *local_1b0;
  ostringstream err;
  cmListFileContext local_198;
  ios_base local_138 [264];
  
  ppTVar5 = (entries->
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (entries->
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = ppTVar5 == local_1d0;
  if (bVar17) {
    bVar11 = 0;
  }
  else {
    local_240 = tgt->Makefile;
    bVar11 = 0;
    local_248 = tgt;
    local_1c8 = dagChecker;
    local_1c0 = config;
    local_1b8 = srcs;
    local_1b0 = &uniqueSrcs->_M_ht;
    do {
      pcVar2 = (*ppTVar5)->LinkImplItem;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      pcVar6 = cmCompiledGeneratorExpression::Evaluate
                         (((*ppTVar5)->ge).x_,local_240,local_1c0,false,local_248,local_248,
                          local_1c8,&usedSources);
      std::__cxx11::string::string((string *)&err,pcVar6,(allocator *)&fullPath);
      cmSystemTools::ExpandListArgument((string *)&err,&entrySources,false);
      if (_err != &local_198) {
        operator_delete(_err,(ulong)(local_198.Name._M_dataplus._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      if ((((*ppTVar5)->ge).x_)->HadContextSensitiveCondition != false) {
        bVar11 = 1;
      }
      bVar18 = entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sourceName = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      while (!bVar18) {
        this_01 = cmMakefile::GetOrCreateSource(local_240,sourceName,false);
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
        psVar7 = cmSourceFile::GetFullPath(this_01,&usedSources);
        pcVar3 = (psVar7->_M_dataplus)._M_p;
        fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fullPath,pcVar3,pcVar3 + psVar7->_M_string_length);
        if (fullPath._M_string_length == 0) {
          if (usedSources._M_string_length != 0) {
            pcVar10 = cmMakefile::GetCMakeInstance(local_240);
            cmake::IssueMessage(pcVar10,FATAL_ERROR,&usedSources,
                                &((local_248->Internal).Pointer)->Backtrace);
          }
LAB_0029a7c9:
          bVar4 = false;
          local_2b1 = bVar11;
        }
        else {
          if (((pcVar2->super_cmLinkItem).super_string._M_string_length != 0) &&
             (bVar4 = cmsys::SystemTools::FileIsFullPath((sourceName->_M_dataplus)._M_p), !bVar4)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
            if ((pcVar2->super_cmLinkItem).super_string._M_string_length == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&err,"Found relative path while evaluating sources of \"",0x31);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&err,(local_248->Name)._M_dataplus._M_p,
                                  (local_248->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\":\n  \"",6);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(sourceName->_M_dataplus)._M_p,sourceName->_M_string_length
                                 );
              lVar14 = 2;
              pcVar6 = "\"\n";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&err,"Target \"",8);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&err,
                                  (pcVar2->super_cmLinkItem).super_string._M_dataplus._M_p,
                                  (pcVar2->super_cmLinkItem).super_string._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(sourceName->_M_dataplus)._M_p,sourceName->_M_string_length
                                 );
              lVar14 = 1;
              pcVar6 = "\"";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,lVar14);
            this = local_248->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(this,FATAL_ERROR,&local_268);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
            std::ios_base::~ios_base(local_138);
            goto LAB_0029a7c9;
          }
          bVar4 = true;
          std::__cxx11::string::_M_assign((string *)sourceName);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
          operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
          operator_delete(usedSources._M_dataplus._M_p,
                          CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                   usedSources.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar4) break;
        sourceName = sourceName + 1;
        bVar18 = sourceName ==
                 entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      paVar16 = &fullPath.field_2;
      if (!bVar18) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&entrySources);
        break;
      }
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_268.field_2;
      pbVar15 = entrySources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar3 = (pbVar15->_M_dataplus)._M_p;
          _err = &local_198;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&err,pcVar3,pcVar3 + pbVar15->_M_string_length);
          this_00 = local_1b0;
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::resize(local_1b0,local_1b0->_M_num_elements + 1);
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert_unique_noresize
                    ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                      *)&fullPath,this_00,(value_type *)&err);
          if ((fullPath.field_2._M_local_buf[0] == '\x01') &&
             (std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_1b8,(value_type *)&err), debugSources)) {
            std::operator+(&local_268," * ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err
                          );
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_268);
            psVar12 = (size_type *)(plVar9 + 2);
            if ((size_type *)*plVar9 == psVar12) {
              fullPath.field_2._M_allocated_capacity = *psVar12;
              fullPath.field_2._8_8_ = plVar9[3];
              fullPath._M_dataplus._M_p = (pointer)paVar16;
            }
            else {
              fullPath.field_2._M_allocated_capacity = *psVar12;
              fullPath._M_dataplus._M_p = (pointer)*plVar9;
            }
            fullPath._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&usedSources,(ulong)fullPath._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fullPath._M_dataplus._M_p != paVar16) {
              operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != paVar1) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (_err != &local_198) {
            operator_delete(_err,(ulong)(local_198.Name._M_dataplus._M_p + 1));
          }
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 !=
                 entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (usedSources._M_string_length != 0) {
        pcVar10 = cmMakefile::GetCMakeInstance(local_240);
        local_1f0[0] = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"Used sources for target ","");
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1f0,(ulong)(local_248->Name)._M_dataplus._M_p);
        local_210 = &local_200;
        plVar13 = plVar9 + 2;
        if ((long *)*plVar9 == plVar13) {
          local_200 = *plVar13;
          lStack_1f8 = plVar9[3];
        }
        else {
          local_200 = *plVar13;
          local_210 = (long *)*plVar9;
        }
        local_208 = plVar9[1];
        *plVar9 = (long)plVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_268.field_2._M_allocated_capacity = *psVar12;
          local_268.field_2._8_8_ = plVar9[3];
          local_268._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar12;
          local_268._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_268._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_268,(ulong)usedSources._M_dataplus._M_p);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar12) {
          fullPath.field_2._M_allocated_capacity = *psVar12;
          fullPath.field_2._8_8_ = plVar9[3];
          fullPath._M_dataplus._M_p = (pointer)paVar16;
        }
        else {
          fullPath.field_2._M_allocated_capacity = *psVar12;
          fullPath._M_dataplus._M_p = (pointer)*plVar9;
        }
        fullPath._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        __x = ((*ppTVar5)->ge).x_;
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&err,
                   (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)__x);
        local_198.Name.field_2._8_8_ = (__x->Backtrace).Snapshot.Position.Position;
        local_198.Name._M_string_length = (size_type)(__x->Backtrace).Snapshot.State;
        local_198.Name.field_2._M_allocated_capacity =
             (size_type)(__x->Backtrace).Snapshot.Position.Tree;
        cmake::IssueMessage(pcVar10,LOG,&fullPath,(cmListFileBacktrace *)&err);
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&err);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
          operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210,local_200 + 1);
        }
        if (local_1f0[0] != local_1e0) {
          operator_delete(local_1f0[0],local_1e0[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&entrySources);
      ppTVar5 = ppTVar5 + 1;
      bVar17 = ppTVar5 == local_1d0;
    } while (!bVar17);
  }
  if (bVar17) {
    local_2b1 = bVar11;
  }
  return (bool)(local_2b1 & 1);
}

Assistant:

static bool processSources(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &srcs,
      UNORDERED_SET<std::string> &uniqueSrcs,
      cmGeneratorExpressionDAGChecker *dagChecker,
      std::string const& config, bool debugSources)
{
  cmMakefile *mf = tgt->GetMakefile();

  bool contextDependent = false;

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              tgt,
                                              dagChecker),
                                    entrySources);

    if ((*it)->ge->GetHadContextSensitiveCondition())
      {
      contextDependent = true;
      }

    for(std::vector<std::string>::iterator i = entrySources.begin();
        i != entrySources.end(); ++i)
      {
      std::string& src = *i;
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if(fullPath.empty())
        {
        if(!e.empty())
          {
          cmake* cm = mf->GetCMakeInstance();
          cm->IssueMessage(cmake::FATAL_ERROR, e,
                          tgt->GetBacktrace());
          }
        return contextDependent;
        }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src.c_str()))
        {
        std::ostringstream err;
        if (!targetName.empty())
          {
          err << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_SOURCES:\n"
            "  \"" << src << "\"";
          }
        else
          {
          err << "Found relative path while evaluating sources of "
          "\"" << tgt->GetName() << "\":\n  \"" << src << "\"\n";
          }
        tgt->GetMakefile()->IssueMessage(cmake::FATAL_ERROR, err.str());
        return contextDependent;
        }
      src = fullPath;
      }
    std::string usedSources;
    for(std::vector<std::string>::iterator
          li = entrySources.begin(); li != entrySources.end(); ++li)
      {
      std::string src = *li;

      if(uniqueSrcs.insert(src).second)
        {
        srcs.push_back(src);
        if (debugSources)
          {
          usedSources += " * " + src + "\n";
          }
        }
      }
    if (!usedSources.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used sources for target ")
                            + tgt->GetName() + ":\n"
                            + usedSources, (*it)->ge->GetBacktrace());
      }
    }
  return contextDependent;
}